

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall Lexer::Lexer(Lexer *this)

{
  this->npos = -1;
  (this->input_)._M_dataplus._M_p = (pointer)&(this->input_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->input_,"");
  this->index_ = 0;
  (this->position_).super_Position.row_ = 1;
  (this->position_).super_Position.col_ = 0;
  (this->position_).super_Position._vptr_Position = (_func_int **)&PTR_clear_00153950;
  this->in_row_comment_ = false;
  this->in_block_comment_ = false;
  this->current_ = this->npos;
  return;
}

Assistant:

Lexer::Lexer() : input_(""), index_(0), in_row_comment_(false), in_block_comment_(false) {
    current_ = npos;
}